

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_25095d::Db::parseTemplateArg(Db *this)

{
  char cVar1;
  Node **ppNVar2;
  Node **ppNVar3;
  Node *in_RAX;
  Node *pNVar4;
  char *pcVar5;
  char *pcVar6;
  Node NVar7;
  Node *Arg;
  
  pcVar5 = this->First;
  pcVar6 = this->Last;
  if (pcVar6 != pcVar5) {
    cVar1 = *pcVar5;
    if (cVar1 == 'J') {
      pcVar5 = pcVar5 + 1;
      this->First = pcVar5;
      ppNVar2 = (this->Names).Last;
      ppNVar3 = (this->Names).First;
      Arg = in_RAX;
      while( true ) {
        if ((pcVar5 != pcVar6) && (*pcVar5 == 'E')) {
          this->First = pcVar5 + 1;
          NVar7 = (Node)popTrailingNodeArray(this,(long)ppNVar2 - (long)ppNVar3 >> 3);
          pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
          pNVar4->K = KTemplateArgumentPack;
          pNVar4->RHSComponentCache = No;
          pNVar4->ArrayCache = No;
          pNVar4->FunctionCache = No;
          pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001c6718;
          pNVar4[1] = NVar7;
          return pNVar4;
        }
        Arg = parseTemplateArg(this);
        if (Arg == (Node *)0x0) break;
        PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&Arg);
        pcVar5 = this->First;
        pcVar6 = this->Last;
      }
    }
    else {
      if (cVar1 == 'L') {
        if (((ulong)((long)pcVar6 - (long)pcVar5) < 2) || (pcVar5[1] != 'Z')) {
          pNVar4 = parseExprPrimary(this);
          return pNVar4;
        }
        this->First = pcVar5 + 2;
        pNVar4 = parseEncoding(this);
      }
      else {
        if (cVar1 != 'X') goto LAB_00175d9d;
        this->First = pcVar5 + 1;
        pNVar4 = parseExpr(this);
      }
      if (((pNVar4 != (Node *)0x0) && (pcVar6 = this->First, pcVar6 != this->Last)) &&
         (*pcVar6 == 'E')) {
        this->First = pcVar6 + 1;
        return pNVar4;
      }
    }
    return (Node *)0x0;
  }
LAB_00175d9d:
  pNVar4 = parseType(this);
  return pNVar4;
}

Assistant:

Node *Db::parseTemplateArg() {
  switch (look()) {
  case 'X': {
    ++First;
    Node *Arg = parseExpr();
    if (Arg == nullptr || !consumeIf('E'))
      return nullptr;
    return Arg;
  }
  case 'J': {
    ++First;
    size_t ArgsBegin = Names.size();
    while (!consumeIf('E')) {
      Node *Arg = parseTemplateArg();
      if (Arg == nullptr)
        return nullptr;
      Names.push_back(Arg);
    }
    NodeArray Args = popTrailingNodeArray(ArgsBegin);
    return make<TemplateArgumentPack>(Args);
  }
  case 'L': {
    //                ::= LZ <encoding> E           # extension
    if (look(1) == 'Z') {
      First += 2;
      Node *Arg = parseEncoding();
      if (Arg == nullptr || !consumeIf('E'))
        return nullptr;
      return Arg;
    }
    //                ::= <expr-primary>            # simple expressions
    return parseExprPrimary();
  }
  default:
    return parseType();
  }
}